

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker_manager.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::tracker_connection::fail_impl
          (tracker_connection *this,error_code *ec,operation_t op,string *msg,seconds32 interval,
          seconds32 min_interval)

{
  shared_ptr<libtorrent::aux::request_callback> cb;
  __shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  ::std::__shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,&this->m_requester);
  if (local_40._M_ptr != (element_type *)0x0) {
    if (interval.__r != 0) {
      min_interval.__r = interval.__r;
    }
    (*(local_40._M_ptr)->_vptr_request_callback[5])
              (local_40._M_ptr,&this->m_req,ec,op,msg,(ulong)(uint)min_interval.__r);
  }
  (*(this->super_timeout_handler)._vptr_timeout_handler[4])(this);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  return;
}

Assistant:

void tracker_connection::fail_impl(error_code const& ec, operation_t const op
		, std::string const msg, seconds32 const interval, seconds32 const min_interval)
	{
		std::shared_ptr<request_callback> cb = requester();
		if (cb) cb->tracker_request_error(m_req, ec, op, msg
			, interval.count() == 0 ? min_interval : interval);
		close();
	}